

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

void Saig_ManBmcCreateCnf_iter(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame,Vec_Int_t *vVisit)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t *pObj_00;
  long lVar7;
  
  while( true ) {
    iVar3 = Saig_ManBmcLiteral(p,pObj,iFrame);
    if (iVar3 != -1) {
      return;
    }
    pAVar1 = p->pAig;
    if (pObj->TravId == pAVar1->nTravIds) {
      return;
    }
    pObj->TravId = pAVar1->nTravIds;
    uVar5 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar6 = uVar5 & 7;
    if (uVar6 != 3) break;
    pObj = (Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
  }
  if (uVar6 == 2) {
    if ((pObj->field_0).CioId < pAVar1->nTruePis) {
      return;
    }
    uVar5 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
    if ((-1 < (int)uVar5) && ((int)uVar5 < pAVar1->vCos->nSize)) {
      Vec_IntPush(vVisit,*(int *)((long)pAVar1->vCos->pArray[uVar5] + 0x24));
      return;
    }
LAB_0056f722:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if ((uVar5 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                  ,0x488,
                  "void Saig_ManBmcCreateCnf_iter(Gia_ManBmc_t *, Aig_Obj_t *, int, Vec_Int_t *)");
  }
  piVar4 = Saig_ManBmcMapping((Gia_ManBmc_t *)p->vMapping,(Aig_Obj_t *)(ulong)(uint)pObj->Id);
  lVar7 = 0;
  do {
    uVar5 = piVar4[lVar7 + 1];
    if ((ulong)uVar5 != 0xffffffff) {
      pVVar2 = p->pAig->vObjs;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        pObj_00 = (Aig_Obj_t *)0x0;
      }
      else {
        if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_0056f722;
        pObj_00 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
      }
      Saig_ManBmcCreateCnf_iter(p,pObj_00,iFrame,vVisit);
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void Saig_ManBmcCreateCnf_iter( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame, Vec_Int_t * vVisit )
{
    if ( Saig_ManBmcLiteral( p, pObj, iFrame ) != ~0 )
        return; 
    if ( Aig_ObjIsTravIdCurrent(p->pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            Vec_IntPush( vVisit, Saig_ObjLoToLi(p->pAig, pObj)->Id );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManBmcCreateCnf_iter( p, Aig_ObjFanin0(pObj), iFrame, vVisit );
        return;
    }
    else
    {
        int * pMapping, i;
        assert( Aig_ObjIsNode(pObj) );
        pMapping = Saig_ManBmcMapping( p, pObj );
        for ( i = 0; i < 4; i++ )
            if ( pMapping[i+1] != -1 )
                Saig_ManBmcCreateCnf_iter( p, Aig_ManObj(p->pAig, pMapping[i+1]), iFrame, vVisit );
    }
}